

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O3

Buffer * __thiscall
Potassco::StringBuilder::grow(Buffer *__return_storage_ptr__,StringBuilder *this,size_t n)

{
  Buffer *pBVar1;
  StringBuilder temp;
  
  pBVar1 = (Buffer *)
           (*(code *)(&DAT_0011ffcc +
                     *(int *)(&DAT_0011ffcc + (ulong)((byte)(this->field_0).sbo_[0x3f] >> 6) * 4)))
                     ();
  return pBVar1;
}

Assistant:

StringBuilder::Buffer StringBuilder::grow(std::size_t n) {
	Buffer ret;
	Type bft = type();
	if (bft == Sbo && tag() >= n) {
		ret = buffer();
		setTag(static_cast<uint8_t>(tag() - n));
	}
	else if (bft == Buf && (buf_.free() >= n || (tag() & Own) == 0u)) {
		ret = buf_;
		if ((buf_.used += n) > buf_.size) {
			errno = ERANGE;
			buf_.used = buf_.size;
		}
	}
	else {
		if (bft != Str) {
			// switch to dynamic string-based buffer
			StringBuilder temp;
			temp.str_ = new std::string;
			temp.setTag(Str|Own);
			Buffer current = buffer();
			temp.str_->reserve(current.used + n);
			temp.str_->append(current.head, current.used);
			setTag(temp.tag());
			str_ = temp.str_;
			temp.str_ = 0;
		}
		str_->append(n, '\0');
		ret.head = const_cast<char*>(&str_->operator[](0));
		ret.used = str_->size() - n;
		ret.size = str_->size();
	}
	return ret;
}